

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.cc
# Opt level: O3

void __thiscall Filter::reset(Filter *this)

{
  int iVar1;
  int iVar2;
  
  this->fc = 0;
  this->res = 0;
  this->filt = 0;
  this->voice3off = 0;
  this->hp_bp_lp = 0;
  this->vol = 0;
  this->Vhp = 0;
  this->Vbp = 0;
  this->Vlp = 0;
  this->Vnf = 0;
  iVar1 = (int)((double)*this->f0 * 6.283185307179586 * 1.048576);
  iVar2 = 0x19bc6;
  if (iVar1 < 0x19bc6) {
    iVar2 = iVar1;
  }
  this->w0 = iVar1;
  this->w0_ceil_1 = iVar2;
  iVar2 = 0x66f1;
  if (iVar1 < 0x66f1) {
    iVar2 = iVar1;
  }
  this->w0_ceil_dt = iVar2;
  this->_1024_div_Q = 0x5a8;
  return;
}

Assistant:

void Filter::reset()
{
  fc = 0;

  res = 0;

  filt = 0;

  voice3off = 0;

  hp_bp_lp = 0;

  vol = 0;

  // State of filter.
  Vhp = 0;
  Vbp = 0;
  Vlp = 0;
  Vnf = 0;

  set_w0();
  set_Q();
}